

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

int decode_encoded_header_info(archive_read *a,_7z_stream_info *si)

{
  long lVar1;
  int iVar2;
  int *piVar3;
  long *in_RSI;
  archive *in_RDI;
  _7z_stream_info *unaff_retaddr;
  _7zip *zip;
  int local_4;
  
  lVar1 = *(long *)in_RDI[0x15].archive_format_name;
  piVar3 = __errno_location();
  *piVar3 = 0;
  iVar2 = read_StreamsInfo((archive_read *)zip,unaff_retaddr);
  if (iVar2 < 0) {
    piVar3 = __errno_location();
    if (*piVar3 == 0xc) {
      archive_set_error(in_RDI,-1,"Couldn\'t allocate memory");
    }
    else {
      archive_set_error(in_RDI,-1,"Malformed 7-Zip archive");
    }
    local_4 = -0x1e;
  }
  else if ((in_RSI[1] == 0) || (in_RSI[6] == 0)) {
    archive_set_error(in_RDI,-1,"Malformed 7-Zip archive");
    local_4 = -0x1e;
  }
  else if ((*(ulong *)(lVar1 + 0x80) < (ulong)(*in_RSI + *(long *)in_RSI[2])) ||
          (((*in_RSI + *(long *)in_RSI[2] < 0 || (*(long *)in_RSI[2] == 0)) || (*in_RSI < 0)))) {
    archive_set_error(in_RDI,-1,"Malformed Header offset");
    local_4 = -0x1e;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
decode_encoded_header_info(struct archive_read *a, struct _7z_stream_info *si)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;

	errno = 0;
	if (read_StreamsInfo(a, si) < 0) {
		if (errno == ENOMEM)
			archive_set_error(&a->archive, -1,
			    "Couldn't allocate memory");
		else
			archive_set_error(&a->archive, -1,
			    "Malformed 7-Zip archive");
		return (ARCHIVE_FATAL);
	}

	if (si->pi.numPackStreams == 0 || si->ci.numFolders == 0) {
		archive_set_error(&a->archive, -1, "Malformed 7-Zip archive");
		return (ARCHIVE_FATAL);
	}

	if (zip->header_offset < si->pi.pos + si->pi.sizes[0] ||
	    (int64_t)(si->pi.pos + si->pi.sizes[0]) < 0 ||
	    si->pi.sizes[0] == 0 || (int64_t)si->pi.pos < 0) {
		archive_set_error(&a->archive, -1, "Malformed Header offset");
		return (ARCHIVE_FATAL);
	}

	return (ARCHIVE_OK);
}